

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::SequenceConcatExpr::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (SequenceConcatExpr *this,ContinuousAssignVisitor *visitor)

{
  Element *elem;
  pointer pEVar1;
  long lVar2;
  
  pEVar1 = (this->elements)._M_ptr;
  for (lVar2 = (this->elements)._M_extent._M_extent_value * 0x28; lVar2 != 0; lVar2 = lVar2 + -0x28)
  {
    AssertionExpr::visit<slang::analysis::NonProceduralExprVisitor>((pEVar1->sequence).ptr,visitor);
    pEVar1 = pEVar1 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& elem : elements)
            elem.sequence->visit(visitor);
    }